

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O2

int __thiscall QCache<QString,_QConfFile>::unlink(QCache<QString,_QConfFile> *this,char *__name)

{
  long lVar1;
  long *plVar2;
  int extraout_EAX;
  Bucket bucket;
  
  lVar1 = *(long *)__name;
  plVar2 = *(long **)(__name + 8);
  *(long **)(lVar1 + 8) = plVar2;
  *plVar2 = lVar1;
  this->total = this->total - *(long *)(__name + 0x30);
  bucket = QHashPrivate::Data<QCache<QString,_QConfFile>::Node>::findBucket<QString>
                     (&this->d,(QString *)(__name + 0x10));
  QHashPrivate::Data<QCache<QString,_QConfFile>::Node>::erase(&this->d,bucket);
  return extraout_EAX;
}

Assistant:

void unlink(Node *n) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        Q_ASSERT(n->prev);
        Q_ASSERT(n->next);
        n->prev->next = n->next;
        n->next->prev = n->prev;
        total -= n->value.cost;
        auto it = d.findBucket(n->key);
        d.erase(it);
    }